

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

uint64_t __thiscall
slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
          (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this,
          basic_string_view<char,_std::char_traits<char>_> *sv)

{
  uint64_t uVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  size_t in_stack_00000068;
  void *in_stack_00000070;
  
  std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
  std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
  uVar1 = detail::hashing::hash(in_stack_00000070,in_stack_00000068);
  return uVar1;
}

Assistant:

uint64_t operator()(const std::basic_string_view<CharT>& sv) const noexcept {
        return detail::hashing::hash(sv.data(), sizeof(CharT) * sv.size());
    }